

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_xml.hpp
# Opt level: O1

ptree * lattice::operator>>(ptree *pt,graph *lat)

{
  long *plVar1;
  undefined4 uVar2;
  double dVar3;
  graph *pgVar4;
  int iVar5;
  path_type *ppVar6;
  long lVar7;
  int *piVar8;
  path_type *ppVar9;
  long lVar10;
  char *pcVar11;
  invalid_argument *piVar12;
  undefined8 uVar13;
  bool bVar14;
  char *pcVar15;
  Index othersize;
  pointer rows;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> str;
  coordinate_t pos;
  istringstream is;
  undefined1 local_238 [24];
  undefined1 local_220 [24];
  graph *local_208;
  char *local_200;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1f8;
  ptree *local_1e0;
  char *local_1d8;
  long local_1d0;
  char *local_1c8;
  pointer local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1a8;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  vStack_198;
  void *local_180;
  undefined8 uStack_178;
  long local_170;
  ios_base local_140 [272];
  
  local_208 = lat;
  local_1b8._0_8_ = &aStack_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"<xmlattr>.dimension","");
  vStack_198.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(vStack_198.
                         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,'.');
  vStack_198.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8._0_8_;
  local_1e0 = pt;
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_238,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)pt,(path_type *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &aStack_1a8) {
    operator_delete((void *)local_1b8._0_8_,aStack_1a8._M_allocated_capacity + 1);
  }
  uVar13 = local_238._8_8_;
  if (local_238[0] == (string)0x1) {
    ppVar6 = (path_type *)__errno_location();
    uVar2 = *(undefined4 *)&(ppVar6->m_value)._M_dataplus._M_p;
    *(undefined4 *)&(ppVar6->m_value)._M_dataplus._M_p = 0;
    lVar7 = strtol((char *)uVar13,(char **)local_1b8,10);
    if (local_1b8._0_8_ == uVar13) {
LAB_0011a020:
      std::__throw_invalid_argument("stoi");
    }
    else if ((0xfffffffeffffffff < lVar7 - 0x80000000U) &&
            (iVar5 = *(int *)&(ppVar6->m_value)._M_dataplus._M_p, iVar5 != 0x22)) {
      if (iVar5 == 0) {
        *(undefined4 *)&(ppVar6->m_value)._M_dataplus._M_p = uVar2;
      }
      rows = (pointer)(long)(int)lVar7;
      goto LAB_00119502;
    }
    std::__throw_out_of_range("stoi");
  }
  else {
    rows = (pointer)0x0;
LAB_00119502:
    if ((local_238[0] == (string)0x1) && ((undefined1 *)local_238._8_8_ != local_220)) {
      operator_delete((void *)local_238._8_8_,local_220._0_8_ + 1);
    }
    pgVar4 = local_208;
    vStack_198.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_198.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_198.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_180 = (void *)0x0;
    uStack_178 = 0;
    local_170 = 0;
    local_208->dim_ = (size_t)rows;
    local_238._0_8_ =
         (local_208->sites_).
         super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl
         .super__Vector_impl_data._M_start;
    local_238._8_8_ =
         (local_208->sites_).
         super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl
         .super__Vector_impl_data._M_finish;
    local_238._16_8_ =
         (local_208->sites_).
         super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    (local_208->sites_).
    super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_208->sites_).
    super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_208->sites_).
    super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b8._8_8_ = (pointer)0x0;
    aStack_1a8._M_allocated_capacity = 0;
    aStack_1a8._8_8_ = 0;
    local_1b8._0_8_ = rows;
    std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::~vector
              ((vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_> *)local_238)
    ;
    local_238._0_8_ =
         (pgVar4->coordinates_).
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_238._8_8_ =
         (pgVar4->coordinates_).
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_238._16_8_ =
         (pgVar4->coordinates_).
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pgVar4->coordinates_).
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         vStack_198.
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (pgVar4->coordinates_).
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         vStack_198.
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pgVar4->coordinates_).
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         vStack_198.
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    vStack_198.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_198.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_198.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)local_238);
    std::vector<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>::_M_move_assign
              (&pgVar4->bonds_,&local_180);
    if (local_180 != (void *)0x0) {
      operator_delete(local_180,local_170 - (long)local_180);
    }
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::~vector(&vStack_198);
    std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::~vector
              ((vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_> *)
               (local_1b8 + 8));
    local_1b8._0_8_ = &aStack_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"<xmlattr>.vertices","");
    vStack_198.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(vStack_198.
                           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,'.');
    vStack_198.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8._0_8_;
    boost::property_tree::
    basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
    get_optional<std::__cxx11::string>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_238,
               (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                *)local_1e0,(path_type *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ != &aStack_1a8) {
      operator_delete((void *)local_1b8._0_8_,aStack_1a8._M_allocated_capacity + 1);
    }
    uVar13 = local_238._8_8_;
    if (local_238[0] != (string)0x1) {
      lVar7 = 0;
LAB_001196fd:
      if (local_238[0] == (string)0x1) {
        if ((undefined1 *)local_238._8_8_ != local_220) {
          operator_delete((void *)local_238._8_8_,local_220._0_8_ + 1);
        }
        local_238._0_8_ = local_238._0_8_ & 0xffffffffffffff00;
      }
      local_1c8 = *(char **)((long)local_1e0->m_children + 8);
      pcVar15 = (char *)(*(long *)(local_1c8 + 0x68) + -0x60);
      if (*(long *)(local_1c8 + 0x68) == 0) {
        pcVar15 = (char *)0x0;
      }
      local_1d0 = lVar7;
      if (pcVar15 != local_1c8) {
        do {
          iVar5 = std::__cxx11::string::compare(pcVar15);
          pcVar11 = pcVar15;
          if (iVar5 == 0) {
            local_1f8.m_storage.m_data = (double *)0x0;
            local_1f8.m_storage.m_rows = 0;
            local_200 = pcVar15;
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_1f8,(Index)rows,1);
            if ((pointer)local_1f8.m_storage.m_rows != rows) {
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&local_1f8,(Index)rows,1);
            }
            if (0 < local_1f8.m_storage.m_rows) {
              memset(local_1f8.m_storage.m_data,0,local_1f8.m_storage.m_rows << 3);
            }
            if (local_208->dim_ != 0) {
              local_1d8 = *(char **)(*(long *)(local_200 + 0x40) + 8);
              pcVar15 = (char *)(*(long *)(local_1d8 + 0x68) + -0x60);
              if (*(long *)(local_1d8 + 0x68) == 0) {
                pcVar15 = (char *)0x0;
              }
              if (pcVar15 != local_1d8) {
                bVar14 = false;
                do {
                  iVar5 = std::__cxx11::string::compare(pcVar15);
                  if (iVar5 == 0) {
                    if (bVar14) {
LAB_00119f23:
                      piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
                      std::invalid_argument::invalid_argument(piVar12,"duplicated <COORDINATE> tag")
                      ;
                      __cxa_throw(piVar12,&std::invalid_argument::typeinfo,
                                  std::invalid_argument::~invalid_argument);
                    }
                    std::__cxx11::istringstream::istringstream
                              ((istringstream *)local_1b8,(string *)(pcVar15 + 0x20),_S_in);
                    local_238._0_8_ = local_238 + 0x10;
                    local_238._8_8_ = (type)0x0;
                    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
                    if (rows != (pointer)0x0) {
                      lVar7 = 0;
                      do {
                        std::operator>>((istream *)local_1b8,(string *)local_238);
                        uVar13 = local_238._0_8_;
                        piVar8 = __errno_location();
                        iVar5 = *piVar8;
                        *piVar8 = 0;
                        dVar3 = strtod((char *)uVar13,(char **)&local_1c0);
                        if (local_1c0 == (pointer)uVar13) {
                          std::__throw_invalid_argument("stod");
LAB_00119f17:
                          std::__throw_out_of_range("stod");
                          goto LAB_00119f23;
                        }
                        if (*piVar8 == 0) {
                          *piVar8 = iVar5;
                        }
                        else if (*piVar8 == 0x22) goto LAB_00119f17;
                        local_1f8.m_storage.m_data[lVar7] = dVar3;
                        lVar7 = lVar7 + 1;
                      } while (rows != (pointer)lVar7);
                    }
                    if ((pointer)local_238._0_8_ != (pointer)(local_238 + 0x10)) {
                      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
                    }
                    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b8);
                    std::ios_base::~ios_base(local_140);
                    bVar14 = true;
                  }
                  plVar1 = (long *)(pcVar15 + 0x68);
                  pcVar15 = (char *)(*plVar1 + -0x60);
                  if (*plVar1 == 0) {
                    pcVar15 = (char *)0x0;
                  }
                } while (pcVar15 != local_1d8);
              }
            }
            local_1b8._0_8_ = &aStack_1a8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"<xmlattr>.type","")
            ;
            vStack_198.
            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(vStack_198.
                                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,'.');
            vStack_198.
            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8._0_8_;
            boost::property_tree::
            basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
            get_optional<std::__cxx11::string>
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_238,
                       (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                        *)(local_200 + 0x20),(path_type *)local_1b8);
            lVar7 = local_1d0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._0_8_ != &aStack_1a8) {
              operator_delete((void *)local_1b8._0_8_,aStack_1a8._M_allocated_capacity + 1);
            }
            uVar13 = local_238._8_8_;
            ppVar9 = (path_type *)0x0;
            if (local_238[0] == (string)0x1) {
              piVar8 = __errno_location();
              iVar5 = *piVar8;
              *piVar8 = 0;
              ppVar9 = (path_type *)strtol((char *)uVar13,(char **)local_1b8,10);
              ppVar6 = (path_type *)local_1b8;
              if (local_1b8._0_8_ == uVar13) goto LAB_0011a014;
              if ((&ppVar9[-0x2aaaaab].m_value.field_2 <
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0xffffffff00000000) || (*piVar8 == 0x22)) goto LAB_0011a008;
              if (*piVar8 == 0) {
                *piVar8 = iVar5;
              }
            }
            if (local_238[0] == (string)0x1) {
              if ((undefined1 *)local_238._8_8_ != local_220) {
                operator_delete((void *)local_238._8_8_,local_220._0_8_ + 1);
              }
              local_238._0_8_ = local_238._0_8_ & 0xffffffffffffff00;
            }
            graph::add_site(local_208,(coordinate_t *)&local_1f8,(int)ppVar9);
            free(local_1f8.m_storage.m_data);
            pcVar11 = local_200;
          }
          pcVar15 = (char *)(*(long *)(pcVar11 + 0x68) + -0x60);
          if (*(long *)(pcVar11 + 0x68) == 0) {
            pcVar15 = (char *)0x0;
          }
        } while (pcVar15 != local_1c8);
      }
      lVar10 = (long)(local_208->sites_).
                     super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_208->sites_).
                     super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if (lVar10 == 0) {
        local_1b8._0_8_ = (type)0x0;
        local_1b8._8_8_ = (pointer)0x0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1b8,(Index)rows
                   ,1);
        if ((pointer)local_1b8._8_8_ != rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1b8,
                     (Index)rows,1);
        }
        if (0 < (long)local_1b8._8_8_) {
          memset((void *)local_1b8._0_8_,0,local_1b8._8_8_ << 3);
        }
        if (lVar7 != 0) {
          do {
            graph::add_site(local_208,(coordinate_t *)local_1b8,0);
            local_1d0 = local_1d0 + -1;
          } while (local_1d0 != 0);
        }
        free((void *)local_1b8._0_8_);
      }
      else if ((lVar7 != 0) && ((lVar10 >> 3) * 0x6db6db6db6db6db7 - lVar7 != 0)) {
        piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar12,"inconsistent number of sites");
        __cxa_throw(piVar12,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      pcVar11 = *(char **)((long)local_1e0->m_children + 8);
      pcVar15 = (char *)(*(long *)(pcVar11 + 0x68) + -0x60);
      if (*(long *)(pcVar11 + 0x68) == 0) {
        pcVar15 = (char *)0x0;
      }
      local_200 = pcVar11;
      if (pcVar15 != pcVar11) {
        do {
          iVar5 = std::__cxx11::string::compare(pcVar15);
          if (iVar5 == 0) {
            ppVar6 = (path_type *)(pcVar15 + 0x20);
            local_1b8._0_8_ = &aStack_1a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b8,"<xmlattr>.source","");
            vStack_198.
            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(vStack_198.
                                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,'.');
            vStack_198.
            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8._0_8_;
            boost::property_tree::
            basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
            get_optional<std::__cxx11::string>
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_238,
                       (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                        *)ppVar6,(path_type *)local_1b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._0_8_ != &aStack_1a8) {
              operator_delete((void *)local_1b8._0_8_,aStack_1a8._M_allocated_capacity + 1);
            }
            uVar13 = local_238._8_8_;
            if (local_238[0] != (string)0x1) {
LAB_00119f66:
              piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(piVar12,"source attribute not found");
              __cxa_throw(piVar12,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            piVar8 = __errno_location();
            iVar5 = *piVar8;
            *piVar8 = 0;
            pcVar11 = (char *)strtol((char *)uVar13,(char **)local_1b8,10);
            if (local_1b8._0_8_ == uVar13) {
              std::__throw_invalid_argument("stoi");
LAB_00119fa6:
              std::__throw_out_of_range("stoi");
LAB_00119fb2:
              piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(piVar12,"target attribute not found");
              __cxa_throw(piVar12,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            if ((pcVar11 + -0x80000000 < (char *)0xffffffff00000000) || (*piVar8 == 0x22)) {
              std::__throw_out_of_range("stoi");
              goto LAB_00119f66;
            }
            if (*piVar8 == 0) {
              *piVar8 = iVar5;
            }
            local_1d8 = pcVar11;
            if (local_238[0] == (string)0x1) {
              if ((undefined1 *)local_238._8_8_ != local_220) {
                operator_delete((void *)local_238._8_8_,local_220._0_8_ + 1);
              }
              local_238._0_8_ = local_238._0_8_ & 0xffffffffffffff00;
            }
            local_1b8._0_8_ = &aStack_1a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b8,"<xmlattr>.target","");
            vStack_198.
            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(vStack_198.
                                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,'.');
            vStack_198.
            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8._0_8_;
            boost::property_tree::
            basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
            get_optional<std::__cxx11::string>
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_238,
                       (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                        *)ppVar6,(path_type *)local_1b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._0_8_ != &aStack_1a8) {
              operator_delete((void *)local_1b8._0_8_,aStack_1a8._M_allocated_capacity + 1);
            }
            uVar13 = local_238._8_8_;
            if (local_238[0] != (string)0x1) goto LAB_00119fb2;
            iVar5 = *piVar8;
            *piVar8 = 0;
            lVar7 = strtol((char *)local_238._8_8_,(char **)local_1b8,10);
            if (local_1b8._0_8_ != uVar13) {
              if ((lVar7 - 0x80000000U < 0xffffffff00000000) || (*piVar8 == 0x22))
              goto LAB_00119fa6;
              if (*piVar8 == 0) {
                *piVar8 = iVar5;
              }
              if (local_238[0] == (string)0x1) {
                if ((undefined1 *)local_238._8_8_ != local_220) {
                  operator_delete((void *)local_238._8_8_,local_220._0_8_ + 1);
                }
                local_238._0_8_ = local_238._0_8_ & 0xffffffffffffff00;
              }
              local_1b8._0_8_ = &aStack_1a8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1b8,"<xmlattr>.type","");
              vStack_198.
              super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)CONCAT71(vStack_198.
                                     super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,'.');
              vStack_198.
              super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8._0_8_;
              boost::property_tree::
              basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              ::get_optional<std::__cxx11::string>
                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_238,
                         (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                          *)ppVar6,(path_type *)local_1b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8._0_8_ != &aStack_1a8) {
                operator_delete((void *)local_1b8._0_8_,aStack_1a8._M_allocated_capacity + 1);
              }
              uVar13 = local_238._8_8_;
              ppVar6 = (path_type *)0x0;
              if (local_238[0] == (string)0x1) {
                iVar5 = *piVar8;
                *piVar8 = 0;
                ppVar6 = (path_type *)strtol((char *)local_238._8_8_,(char **)local_1b8,10);
                ppVar9 = (path_type *)0x0;
                if (local_1b8._0_8_ == uVar13) goto LAB_00119ffc;
                if ((&ppVar6[-0x2aaaaab].m_value.field_2 <
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0xffffffff00000000) || (*piVar8 == 0x22)) goto LAB_00119ff0;
                if (*piVar8 == 0) {
                  *piVar8 = iVar5;
                }
              }
              pcVar11 = local_200;
              if (local_238[0] == (string)0x1) {
                if ((undefined1 *)local_238._8_8_ != local_220) {
                  operator_delete((void *)local_238._8_8_,local_220._0_8_ + 1);
                }
                local_238._0_8_ = local_238._0_8_ & 0xffffffffffffff00;
              }
              graph::add_bond(local_208,(long)(int)local_1d8 - 1,(long)(int)lVar7 - 1,(int)ppVar6);
              goto LAB_00119edc;
            }
            std::__throw_invalid_argument("stoi");
LAB_00119ff0:
            std::__throw_out_of_range("stoi");
            ppVar9 = ppVar6;
LAB_00119ffc:
            std::__throw_invalid_argument("stoi");
LAB_0011a008:
            std::__throw_out_of_range("stoi");
            ppVar6 = ppVar9;
LAB_0011a014:
            std::__throw_invalid_argument("stoi");
            goto LAB_0011a020;
          }
LAB_00119edc:
          plVar1 = (long *)(pcVar15 + 0x68);
          pcVar15 = (char *)(*plVar1 + -0x60);
          if (*plVar1 == 0) {
            pcVar15 = (char *)0x0;
          }
        } while (pcVar15 != pcVar11);
      }
      return local_1e0;
    }
    ppVar6 = (path_type *)__errno_location();
    uVar2 = *(undefined4 *)&(ppVar6->m_value)._M_dataplus._M_p;
    *(undefined4 *)&(ppVar6->m_value)._M_dataplus._M_p = 0;
    lVar7 = strtol((char *)uVar13,(char **)local_1b8,10);
    if (local_1b8._0_8_ != uVar13) {
      if ((0xfffffffeffffffff < lVar7 - 0x80000000U) &&
         (iVar5 = *(int *)&(ppVar6->m_value)._M_dataplus._M_p, iVar5 != 0x22)) {
        if (iVar5 == 0) {
          *(undefined4 *)&(ppVar6->m_value)._M_dataplus._M_p = uVar2;
        }
        lVar7 = (long)(int)lVar7;
        goto LAB_001196fd;
      }
      goto LAB_0011a044;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0011a044:
  uVar13 = std::__throw_out_of_range("stoi");
  __cxa_free_exception(ppVar6);
  _Unwind_Resume(uVar13);
}

Assistant:

inline ptree& operator>>(ptree& pt, graph& lat) {
  std::size_t dim = 0;
  if (auto str = pt.get_optional<std::string>("<xmlattr>.dimension")) {
    dim = stoi(str.get());
  }
  lat = graph(dim);

  std::size_t ns = 0;
  if (auto str = pt.get_optional<std::string>("<xmlattr>.vertices")) ns = stoi(str.get());

  for (auto& v : pt) {
    if (v.first == "VERTEX") {
      bool found_pos = false;
      coordinate_t pos = coordinate_t::Zero(dim);
      int tp = 0;
      if (lat.dimension() > 0) {
        for (auto& c : v.second) {
          if (c.first == "COORDINATE") {
            if (found_pos) throw std::invalid_argument("duplicated <COORDINATE> tag");
            std::istringstream is(c.second.data());
            std::string sin;
            for (std::size_t m = 0; m < dim; ++m) {
              is >> sin;
              pos(m) = stod(sin);
            }
            found_pos = true;
          }
        }
      }
      if (auto str = v.second.get_optional<std::string>("<xmlattr>.type")) tp = stoi(str.get());
      lat.add_site(pos, tp);
    }
  }
     
  if (lat.num_sites() > 0) {
    if (ns > 0 && lat.num_sites() != ns)
      throw std::invalid_argument("inconsistent number of sites");
  } else {
    coordinate_t pos = coordinate_t::Zero(dim);
    for (std::size_t i = 0; i < ns; ++i) lat.add_site(pos, 0);
  }
  
  for (auto& e : pt) {
    if (e.first == "EDGE") {
      std::size_t source, target; // offset one
      int tp = 0;
      if (auto str = e.second.get_optional<std::string>("<xmlattr>.source")) {
        source = stoi(str.get());
      } else {
        throw std::invalid_argument("source attribute not found");
      }
      if (auto str = e.second.get_optional<std::string>("<xmlattr>.target")) {
        target = stoi(str.get());
      } else {
        throw std::invalid_argument("target attribute not found");
      }
      if (auto str = e.second.get_optional<std::string>("<xmlattr>.type")) tp = stoi(str.get());
      lat.add_bond(source - 1, target - 1, tp);
    }
  }
  return pt;
}